

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

bool __thiscall QAccessibleTable::isSelected(QAccessibleTable *this,QAccessibleInterface *childCell)

{
  byte bVar1;
  char *pcVar2;
  QAccessibleTableCellInterface *pQVar3;
  QDebug *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  QAccessibleTableCellInterface *cell;
  char *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  QMessageLogger *in_stack_ffffffffffffffb0;
  bool local_31;
  char *in_stack_ffffffffffffffe8;
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (QDebug *)0x0) {
    pcVar2 = (char *)(**(code **)(in_RSI->stream + 0x40))();
    if (pcVar2 == in_RDI + 0x10) {
      pQVar3 = QAccessibleInterface::tableCellInterface((QAccessibleInterface *)0x7f4b09);
      if (pQVar3 == (QAccessibleTableCellInterface *)0x0) {
        local_31 = false;
      }
      else {
        bVar1 = (**(code **)(*(long *)pQVar3 + 0x10))();
        local_31 = (bool)(bVar1 & 1);
      }
      goto LAB_007f4b2e;
    }
  }
  QMessageLogger::QMessageLogger
            (in_stack_ffffffffffffffb0,in_RDI,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  QMessageLogger::warning();
  QDebug::operator<<(in_RSI,in_stack_ffffffffffffffe8);
  QDebug::~QDebug(&local_10);
  local_31 = false;
LAB_007f4b2e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_31;
  }
  __stack_chk_fail();
}

Assistant:

bool QAccessibleTable::isSelected(QAccessibleInterface *childCell) const
{
    if (!childCell || childCell->parent() != this) {
        qWarning() << "QAccessibleTable::isSelected: Accessible interface must be a direct child of the table interface.";
        return false;
    }

    const QAccessibleTableCellInterface *cell = childCell->tableCellInterface();
    if (cell)
        return cell->isSelected();

    return false;
}